

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O0

int compression_init_encoder_lzma(archive *a,la_zstream *lastrm,int level,uint64_t filter_id)

{
  lzma_bool lVar1;
  lzma_ret lVar2;
  lzma_stream *strm_00;
  uint8_t *puVar3;
  int local_b4;
  undefined1 local_b0 [4];
  int r;
  lzma_options_lzma lzma_opt;
  lzma_filter *lzmafilters;
  lzma_stream *strm;
  uint64_t filter_id_local;
  int level_local;
  la_zstream *lastrm_local;
  archive *a_local;
  
  if (lastrm->valid != 0) {
    compression_end(a,lastrm);
  }
  strm_00 = (lzma_stream *)calloc(1,0xa8);
  if (strm_00 == (lzma_stream *)0x0) {
    archive_set_error(a,0xc,"Can\'t allocate memory for lzma stream");
    a_local._4_4_ = -0x1e;
  }
  else {
    lzma_opt.reserved_ptr2 = strm_00 + 1;
    filter_id_local._4_4_ = level;
    if (9 < level) {
      filter_id_local._4_4_ = 9;
    }
    lVar1 = lzma_lzma_preset((lzma_options_lzma *)local_b0,filter_id_local._4_4_);
    if (lVar1 == '\0') {
      *(uint64_t *)lzma_opt.reserved_ptr2 = filter_id;
      *(undefined1 **)((long)lzma_opt.reserved_ptr2 + 8) = local_b0;
      *(undefined8 *)((long)lzma_opt.reserved_ptr2 + 0x10) = 0xffffffffffffffff;
      lVar2 = lzma_properties_size(&lastrm->prop_size,(lzma_filter *)lzma_opt.reserved_ptr2);
      if (lVar2 == LZMA_OK) {
        if (lastrm->prop_size != 0) {
          puVar3 = (uint8_t *)malloc((ulong)lastrm->prop_size);
          lastrm->props = puVar3;
          if (lastrm->props == (uint8_t *)0x0) {
            free(strm_00);
            lastrm->real_stream = (void *)0x0;
            archive_set_error(a,0xc,"Cannot allocate memory");
            return -0x1e;
          }
          lVar2 = lzma_properties_encode((lzma_filter *)lzma_opt.reserved_ptr2,lastrm->props);
          if (lVar2 != LZMA_OK) {
            free(strm_00);
            lastrm->real_stream = (void *)0x0;
            archive_set_error(a,-1,"lzma_properties_encode failed");
            return -0x1e;
          }
        }
        memcpy(strm_00,&compression_init_encoder_lzma::lzma_init_data,0x88);
        lVar2 = lzma_raw_encoder(strm_00,(lzma_filter *)lzma_opt.reserved_ptr2);
        if (lVar2 == LZMA_OK) {
          lastrm->real_stream = strm_00;
          lastrm->valid = 1;
          lastrm->code = compression_code_lzma;
          lastrm->end = compression_end_lzma;
          local_b4 = 0;
        }
        else if (lVar2 == LZMA_MEM_ERROR) {
          free(strm_00);
          lastrm->real_stream = (void *)0x0;
          archive_set_error(a,0xc,
                            "Internal error initializing compression library: Cannot allocate memory"
                           );
          local_b4 = -0x1e;
        }
        else {
          free(strm_00);
          lastrm->real_stream = (void *)0x0;
          archive_set_error(a,-1,
                            "Internal error initializing compression library: It\'s a bug in liblzma"
                           );
          local_b4 = -0x1e;
        }
        a_local._4_4_ = local_b4;
      }
      else {
        free(strm_00);
        lastrm->real_stream = (void *)0x0;
        archive_set_error(a,-1,"lzma_properties_size failed");
        a_local._4_4_ = -0x1e;
      }
    }
    else {
      free(strm_00);
      lastrm->real_stream = (void *)0x0;
      archive_set_error(a,0xc,"Internal error initializing compression library");
      a_local._4_4_ = -0x1e;
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
compression_init_encoder_lzma(struct archive *a,
    struct la_zstream *lastrm, int level, uint64_t filter_id)
{
	static const lzma_stream lzma_init_data = LZMA_STREAM_INIT;
	lzma_stream *strm;
	lzma_filter *lzmafilters;
	lzma_options_lzma lzma_opt;
	int r;

	if (lastrm->valid)
		compression_end(a, lastrm);
	strm = calloc(1, sizeof(*strm) + sizeof(*lzmafilters) * 2);
	if (strm == NULL) {
		archive_set_error(a, ENOMEM,
		    "Can't allocate memory for lzma stream");
		return (ARCHIVE_FATAL);
	}
	lzmafilters = (lzma_filter *)(strm+1);
	if (level > 9)
		level = 9;
	if (lzma_lzma_preset(&lzma_opt, level)) {
		free(strm);
		lastrm->real_stream = NULL;
		archive_set_error(a, ENOMEM,
		    "Internal error initializing compression library");
		return (ARCHIVE_FATAL);
	}
	lzmafilters[0].id = filter_id;
	lzmafilters[0].options = &lzma_opt;
	lzmafilters[1].id = LZMA_VLI_UNKNOWN;/* Terminate */

	r = lzma_properties_size(&(lastrm->prop_size), lzmafilters);
	if (r != LZMA_OK) {
		free(strm);
		lastrm->real_stream = NULL;
		archive_set_error(a, ARCHIVE_ERRNO_MISC,
		    "lzma_properties_size failed");
		return (ARCHIVE_FATAL);
	}
	if (lastrm->prop_size) {
		lastrm->props = malloc(lastrm->prop_size);
		if (lastrm->props == NULL) {
			free(strm);
			lastrm->real_stream = NULL;
			archive_set_error(a, ENOMEM,
			    "Cannot allocate memory");
			return (ARCHIVE_FATAL);
		}
		r = lzma_properties_encode(lzmafilters,  lastrm->props);
		if (r != LZMA_OK) {
			free(strm);
			lastrm->real_stream = NULL;
			archive_set_error(a, ARCHIVE_ERRNO_MISC,
			    "lzma_properties_encode failed");
			return (ARCHIVE_FATAL);
		}
	}

	*strm = lzma_init_data;
	r = lzma_raw_encoder(strm, lzmafilters);
	switch (r) {
	case LZMA_OK:
		lastrm->real_stream = strm;
		lastrm->valid = 1;
		lastrm->code = compression_code_lzma;
		lastrm->end = compression_end_lzma;
		r = ARCHIVE_OK;
		break;
	case LZMA_MEM_ERROR:
		free(strm);
		lastrm->real_stream = NULL;
		archive_set_error(a, ENOMEM,
		    "Internal error initializing compression library: "
		    "Cannot allocate memory");
		r =  ARCHIVE_FATAL;
		break;
        default:
		free(strm);
		lastrm->real_stream = NULL;
		archive_set_error(a, ARCHIVE_ERRNO_MISC,
		    "Internal error initializing compression library: "
		    "It's a bug in liblzma");
		r =  ARCHIVE_FATAL;
		break;
	}
	return (r);
}